

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O3

int ON_BrepExtrudeFace(ON_Brep *brep,int face_index,ON_Curve *path_curve,bool bCap)

{
  uint uVar1;
  TYPE TVar2;
  ON_BrepFace *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_3dVector path_vector_00;
  ON_3dVector path_vector_01;
  bool bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint extruded_trim_count;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  ulong new_capacity;
  long lVar13;
  int iVar14;
  ON_SimpleArray<int> side_face_index;
  ON_SimpleArray<int> side_face_index_loop_mark;
  ON_3dVector path_vector;
  uint local_a4;
  int local_a0;
  int local_9c;
  ON_SimpleArray<int> local_98;
  ON_BrepFace *local_80;
  ON_SimpleArray<int> local_78;
  long local_60;
  long local_58;
  ON_Curve *local_50;
  ON_3dVector local_48;
  
  ON_Brep::DestroyMesh(brep,any_mesh);
  ON_Brep::DestroyRegionTopology(brep);
  uVar12 = 0;
  if ((-1 < face_index) &&
     (uVar12 = 0,
     face_index <
     (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count)) {
    pOVar3 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    uVar10 = (ulong)(uint)face_index;
    uVar1 = pOVar3[uVar10].m_li.m_count;
    new_capacity = (ulong)uVar1;
    if (0 < (int)uVar1) {
      if (uVar1 == 1) {
        iVar7 = ON_BrepExtrudeLoop(brep,*pOVar3[uVar10].m_li.m_a,path_curve,bCap);
        return iVar7;
      }
      local_98._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
      local_98.m_a = (int *)0x0;
      local_98.m_count = 0;
      local_98.m_capacity = 0;
      local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
      local_78.m_a = (int *)0x0;
      local_78.m_count = 0;
      local_78.m_capacity = 0;
      local_50 = path_curve;
      bVar5 = ON_BrepExtrudeHelper_CheckPathCurve(path_curve,&local_48);
      uVar12 = 0;
      if (bVar5) {
        local_58 = (long)(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                         super_ON_ClassArray<ON_BrepFace>.m_count;
        pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
        uVar12 = 0;
        uVar8 = 0;
        extruded_trim_count = 0;
        do {
          iVar7 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                  [uVar10].m_li.m_a[uVar8];
          lVar9 = (long)iVar7;
          if ((lVar9 < 0) ||
             ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count
              <= iVar7)) goto LAB_00401936;
          if (pOVar4[lVar9].m_type - outer < 2) {
            extruded_trim_count = extruded_trim_count + pOVar4[lVar9].m_ti.m_count;
          }
          uVar8 = uVar8 + 1;
        } while (new_capacity != uVar8);
        if (extruded_trim_count != 0) {
          ON_BrepExtrudeHelper_ReserveSpace(brep,extruded_trim_count,(uint)bCap);
          if ((uint)local_98.m_capacity < extruded_trim_count) {
            ON_SimpleArray<int>::SetCapacity(&local_98,(long)(int)extruded_trim_count);
          }
          if ((uint)local_78.m_capacity < uVar1) {
            ON_SimpleArray<int>::SetCapacity(&local_78,new_capacity);
          }
          local_80 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                     m_a + uVar10;
          local_a0 = -1;
          uVar8 = 0;
          local_a4 = 0xffffffff;
          local_60 = uVar10 * 0xd8;
          do {
            local_9c = local_98.m_count;
            ON_SimpleArray<int>::Append(&local_78,&local_9c);
            uVar1 = (local_80->m_li).m_a[uVar8];
            uVar12 = 1;
            if ((-1 < (long)(int)uVar1) &&
               (TVar2 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                        super_ON_ClassArray<ON_BrepLoop>.m_a[(int)uVar1].m_type, TVar2 - outer < 2))
            {
              bVar6 = 0;
              if ((int)local_a4 < 0) {
                bVar6 = bCap;
              }
              bVar11 = TVar2 == outer & bCap;
              if (bVar11 != 0) {
                bCap = (bool)bVar6;
              }
              bVar5 = ON_BrepExtrudeHelper_MakeSides(brep,uVar1,local_50,(bool)(bCap & 1),&local_98)
              ;
              iVar7 = local_a0;
              uVar12 = local_a4;
              if ((int)local_a4 < 0) {
                iVar7 = (int)uVar8;
                uVar12 = uVar1;
              }
              if (bVar11 != 0) {
                local_a4 = uVar12;
                local_a0 = iVar7;
              }
              uVar12 = (uint)bVar5;
            }
            uVar8 = uVar8 + 1;
          } while ((uVar8 < new_capacity) && (uVar12 != 0));
          iVar7 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count;
          iVar14 = iVar7;
          if ((uVar12 != 0) && (((bCap & 1U) != 0 && (-1 < (int)local_a4)))) {
            path_vector_00.y = local_48.y;
            path_vector_00.x = local_48.x;
            path_vector_00.z = local_48.z;
            bVar5 = ON_BrepExtrudeHelper_MakeCap
                              (brep,local_a4,path_vector_00,local_98.m_a + local_78.m_a[local_a0]);
            iVar14 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                     m_count;
            if (bVar5 && iVar7 < iVar14) {
              pOVar3 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                       super_ON_ClassArray<ON_BrepFace>.m_a;
              uVar10 = 0;
              do {
                uVar12 = (local_80->m_li).m_a[uVar10];
                if (((uVar12 != local_a4 && -1 < (int)uVar12) &&
                    ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                     m_a[uVar12].m_type - outer < 2)) &&
                   (path_vector_01.y = local_48.y, path_vector_01.x = local_48.x,
                   path_vector_01.z = local_48.z,
                   bVar5 = ON_BrepExtrudeHelper_MakeTopLoop
                                     (brep,pOVar3 + (long)iVar14 + -1,uVar12,path_vector_01,
                                      local_98.m_a + local_78.m_a[uVar10]), bVar5)) {
                  pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_a;
                  pOVar4[(long)(brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                               super_ON_ClassArray<ON_BrepLoop>.m_count + -1].m_type =
                       pOVar4[uVar12].m_type;
                }
                uVar10 = uVar10 + 1;
              } while (new_capacity != uVar10);
              iVar14 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                       super_ON_ClassArray<ON_BrepFace>.m_count;
              uVar12 = 2;
            }
            else {
              uVar12 = 1;
            }
          }
          if (((((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a)
               ->m_face_uuid).Data4[local_60 + -0x10] == '\x01') && ((int)local_58 < iVar14)) {
            lVar13 = local_58 * 0xd8;
            lVar9 = local_58;
            do {
              ON_Brep::FlipFace(brep,(ON_BrepFace *)
                                     ((((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                        super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                     lVar13 + -0x5c));
              lVar9 = lVar9 + 1;
              lVar13 = lVar13 + 0xd8;
            } while (lVar9 < (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_count);
          }
        }
      }
LAB_00401936:
      ON_SimpleArray<int>::~ON_SimpleArray(&local_78);
      ON_SimpleArray<int>::~ON_SimpleArray(&local_98);
    }
  }
  return uVar12;
}

Assistant:

int ON_BrepExtrudeFace( 
          ON_Brep& brep,
          int face_index,
          const ON_Curve& path_curve,
          bool bCap
          )
{
  int rc = 0; // returns 1 for success with no cap, 2 for success with a cap

  brep.DestroyMesh(ON::any_mesh);
  brep.DestroyRegionTopology();

  if ( face_index < 0 || face_index >= brep.m_F.Count() )
    return false;

  const int face_loop_count = brep.m_F[face_index].m_li.Count();
  if ( face_loop_count < 1 )
    return false;


  if ( brep.m_F[face_index].m_li.Count() == 1 )
  {
    rc = ON_BrepExtrudeLoop( brep, brep.m_F[face_index].m_li[0], path_curve, bCap );
  }
  else
  {
    ON_3dVector path_vector;
    ON_SimpleArray<int> side_face_index;
    ON_SimpleArray<int> side_face_index_loop_mark;
    int li, fli;

    if ( !ON_BrepExtrudeHelper_CheckPathCurve( path_curve, path_vector ) )
      return 0;

    //const int trim_count0 = brep.m_T.Count();
    const int loop_count0 = brep.m_L.Count();
    const int face_count0 = brep.m_F.Count();

    // count number of new objects so we can grow arrays
    // efficiently and use refs to dynamic array elements.
    int new_side_trim_count = 0;
    for ( fli = 0; fli < face_loop_count; fli++ )
    {
      li = brep.m_F[face_index].m_li[fli];
      if ( li < 0 || li >= loop_count0 )
        return false;
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      new_side_trim_count += brep.m_L[li].m_ti.Count();
    }
    if ( new_side_trim_count == 0 )
      return false;
    ON_BrepExtrudeHelper_ReserveSpace( brep, new_side_trim_count, bCap?1:0 );

    side_face_index.Reserve(new_side_trim_count);
    side_face_index_loop_mark.Reserve(face_loop_count);

    const ON_BrepFace& face = brep.m_F[face_index];
  
    rc = true;
    int outer_loop_index = -1;
    int outer_fli = -1;
    for ( fli = 0; fli < face_loop_count && rc; fli++ )
    {
      side_face_index_loop_mark.Append( side_face_index.Count() );
      li = face.m_li[fli];
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      ON_BrepLoop& loop = brep.m_L[li];
      if ( bCap && loop.m_type == ON_BrepLoop::outer )
      {
        if ( outer_loop_index >= 0 )
          bCap = false;
        else 
        {
          outer_loop_index = li;
          outer_fli = fli;
        }
      }
      rc = ON_BrepExtrudeHelper_MakeSides( brep, li, path_curve, bCap, side_face_index );
    }

    if ( bCap && rc && outer_loop_index >= 0 )
    {
      const int face_count1 = brep.m_F.Count();
      bCap = ON_BrepExtrudeHelper_MakeCap( 
                  brep, 
                  outer_loop_index, 
                  path_vector, 
                  side_face_index.Array() + side_face_index_loop_mark[outer_fli] );
      if ( bCap && brep.m_F.Count() > face_count1)
      {
        // put inner bondaries on the cap
        rc = 2;

        ON_BrepFace& cap_face = brep.m_F[brep.m_F.Count()-1];
        for ( fli = 0; fli < face_loop_count && rc; fli++ )
        {
          li = face.m_li[fli];
          if ( li == outer_loop_index )
            continue;
          if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
            continue;
          if ( ON_BrepExtrudeHelper_MakeTopLoop( 
                      brep, 
                      cap_face, 
                      li, 
                      path_vector,
                      side_face_index.Array() + side_face_index_loop_mark[fli] ) )
          {
            ON_BrepLoop& top_loop = brep.m_L[brep.m_L.Count()-1];
            top_loop.m_type = brep.m_L[li].m_type;
          }
        }
      }
    }

    if ( brep.m_F[face_index].m_bRev )
    {
      for ( int fi = face_count0; fi < brep.m_F.Count(); fi++ )
      {
        brep.FlipFace(brep.m_F[fi]);
      }
    }
  }

  return rc;
}